

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O2

void __thiscall gutil::Parameter::addParamDef(Parameter *this,char **pdef)

{
  string s;
  value_type local_68;
  string local_48;
  
  for (; *pdef != (char *)0x0; pdef = pdef + 1) {
    std::__cxx11::string::string((string *)&local_68,*pdef,(allocator *)&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->def,&local_68);
    anon_unknown_4::getValue(&local_48,&local_68);
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if ((local_68._M_string_length != 0) && (*local_68._M_dataplus._M_p == '-')) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->allparam,&local_68);
    }
    std::__cxx11::string::~string((string *)&local_68);
  }
  return;
}

Assistant:

void Parameter::addParamDef(const char *pdef[])
{
  for (int i=0; pdef[i] != 0; i++)
  {
    std::string s=pdef[i];
    def.push_back(s);

    s=getValue(s);

    if (s.size() > 0 && s[0] == '-')
    {
      allparam.insert(s);
    }
  }
}